

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_value.c
# Opt level: O3

char * metacall_value_cast_string(void **v)

{
  type_id tVar1;
  void *v_00;
  char *pcVar2;
  undefined8 unaff_RBX;
  type_id id;
  value in_stack_00000008;
  
  id = (type_id)((ulong)unaff_RBX >> 0x20);
  tVar1 = value_type_id(*v);
  v_00 = *v;
  if (tVar1 != 7) {
    v_00 = value_type_cast(in_stack_00000008,id);
    if (v_00 == (value)0x0) {
      v_00 = *v;
    }
    else {
      *v = v_00;
    }
  }
  pcVar2 = value_to_string(v_00);
  return pcVar2;
}

Assistant:

char *metacall_value_cast_string(void **v)
{
	if (value_type_id(*v) != TYPE_STRING)
	{
		value v_cast = value_type_cast(*v, TYPE_STRING);

		if (v_cast != NULL)
		{
			*v = v_cast;
		}
	}

	return value_to_string(*v);
}